

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

PersistentColumnData * __thiscall
duckdb::StandardColumnData::Serialize
          (PersistentColumnData *__return_storage_ptr__,StandardColumnData *this)

{
  PersistentColumnData local_50;
  
  ColumnData::Serialize(__return_storage_ptr__,&this->super_ColumnData);
  ColumnData::Serialize(&local_50,&(this->validity).super_ColumnData);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&local_50);
  PersistentColumnData::~PersistentColumnData(&local_50);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData StandardColumnData::Serialize() {
	auto persistent_data = ColumnData::Serialize();
	persistent_data.child_columns.push_back(validity.Serialize());
	return persistent_data;
}